

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

bool __thiscall Moc::parseMaybeFunction(Moc *this,ClassDef *cdef,FunctionDef *def)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  qsizetype qVar4;
  Data *pDVar5;
  bool bVar6;
  bool bVar7;
  char *pcVar8;
  Moc *this_00;
  uint uVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_d0;
  undefined1 local_b8 [64];
  Type tempType;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  def->isVirtual = false;
  def->isStatic = false;
  do {
    do {
      do {
        do {
          bVar6 = testForFunctionModifiers(this,def);
        } while (bVar6);
        bVar6 = skipCxxAttributes(this);
      } while (bVar6);
      bVar6 = testFunctionAttribute(this,def);
    } while (bVar6);
    bVar6 = testFunctionRevision(this,def);
  } while (bVar6);
  bVar6 = Parser::test(&this->super_Parser,PP_TILDE);
  parseType(&tempType,this);
  Type::operator=(&def->type,&tempType);
  Type::~Type(&tempType);
  if ((def->type).name.d.size != 0) {
    bVar7 = Parser::test(&this->super_Parser,LPAREN);
    if (bVar7) {
      QByteArray::operator=(&def->name,(QByteArray *)def);
      bVar1 = (def->type).field_0x30;
      bVar7 = operator==(&def->name,(QByteArray *)cdef);
      if (bVar7) {
        uVar9 = (uint)(bVar1 >> 1);
        def->isDestructor = bVar6;
        def->isConstructor = !bVar6;
        tempType.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
             (QFlagsStorageHelper<TypeTag,_4>)(QFlagsStorage<TypeTag>)0x0;
        tempType.firstToken = NOTOKEN;
        tempType.referenceType = NoReference;
        tempType.name.d.d = (Data *)0x0;
        tempType.name.d.ptr = (char *)0x0;
        tempType.name.d.size = 0;
        tempType.rawName.d.d = (Data *)0x0;
        tempType.rawName.d.ptr = (char *)0x0;
        tempType.rawName.d.size = 0;
        tempType._48_4_ = tempType._48_4_ & 0xffffff00;
        Type::operator=(&def->type,&tempType);
        Type::~Type(&tempType);
LAB_0011f150:
        if ((def->type).referenceType == Reference) {
          local_b8._0_8_ = (def->type).rawName.d.d;
          local_b8._8_8_ = (def->type).rawName.d.ptr;
          local_b8._16_8_ = (def->type).rawName.d.size;
          if ((Data *)local_b8._0_8_ != (Data *)0x0) {
            LOCK();
            (((Data *)local_b8._0_8_)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = (((Data *)local_b8._0_8_)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QByteArray::QByteArray((QByteArray *)&local_d0,"void",-1);
          Type::Type(&tempType,(QByteArray *)&local_d0);
          Type::operator=(&def->type,&tempType);
          Type::~Type(&tempType);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_d0);
          QByteArray::operator=(&(def->type).rawName,(QByteArray *)local_b8);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_b8);
        }
        normalizeType(&tempType.name,(QByteArray *)def);
        pDVar5 = (def->normalizedType).d.d;
        pcVar8 = (def->normalizedType).d.ptr;
        (def->normalizedType).d.d = tempType.name.d.d;
        (def->normalizedType).d.ptr = tempType.name.d.ptr;
        qVar4 = (def->normalizedType).d.size;
        (def->normalizedType).d.size = tempType.name.d.size;
        tempType.name.d.d = pDVar5;
        tempType.name.d.ptr = pcVar8;
        tempType.name.d.size = qVar4;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&tempType);
        bVar6 = Parser::test(&this->super_Parser,PP_RPAREN);
        if (!bVar6) {
          parseFunctionArguments(this,def);
          bVar6 = Parser::test(&this->super_Parser,PP_RPAREN);
          if (!bVar6) goto LAB_0011f2f0;
        }
        bVar6 = Parser::test(&this->super_Parser,CONST);
        def->isConst = bVar6;
        bVar6 = true;
        if (((uVar9 & 1) == 0) ||
           (((def->isSignal == false && (def->isSlot == false)) && (def->isInvokable != true))))
        goto LAB_0011f2f2;
        tempType.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        tempType.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        tempType.name.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &def->name;
        local_b8._0_8_ = "parsemaybe: Function declaration ";
        local_b8._16_8_ = " contains extra qualification. Ignoring as signal or slot.";
        QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]>::
        convertTo<QByteArray>
                  (&tempType.name,
                   (QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]>
                    *)local_b8);
        pcVar8 = tempType.name.d.ptr;
        if (tempType.name.d.ptr == (char *)0x0) {
          pcVar8 = &QByteArray::_empty;
        }
        Parser::warning(&this->super_Parser,pcVar8);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&tempType);
      }
    }
    else {
      if (((def->isSlot != false) || (def->isSignal != false)) || (def->isInvokable == true)) {
        do {
          bVar6 = testForFunctionModifiers(this,def);
        } while (bVar6);
      }
      tempType._48_4_ = 0xaaaaaaaa;
      tempType.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
           (QFlagsStorageHelper<TypeTag,_4>)(QFlagsStorage<TypeTag>)0xaaaaaaaa;
      tempType.firstToken = 0xaaaaaaaa;
      tempType.referenceType = 0xaaaaaaaa;
      tempType.rawName.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      tempType.rawName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      tempType.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      tempType.rawName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      tempType.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      tempType.name.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = (Moc *)&tempType;
      parseType(&tempType,this);
      while ((tempType.name.d.size != 0 &&
             ((lVar3 = (this->super_Parser).index, (this->super_Parser).symbols.d.size <= lVar3 ||
              ((this->super_Parser).symbols.d.ptr[lVar3].token != LPAREN))))) {
        bVar6 = testFunctionAttribute(this_00,(def->type).firstToken,def);
        if (!bVar6) {
          local_b8._0_8_ = "Q_SIGNAL";
          bVar6 = operator==((QByteArray *)def,(char **)local_b8);
          if (bVar6) {
            def->isSignal = true;
          }
          else {
            local_b8._0_8_ = "Q_SLOT";
            bVar6 = operator==((QByteArray *)def,(char **)local_b8);
            if (bVar6) {
              def->isSlot = true;
            }
            else {
              if ((def->tag).d.size != 0) {
                QByteArray::append(&def->tag,' ');
              }
              QByteArray::append(&def->tag,(QByteArray *)def);
            }
          }
        }
        Type::operator=(&def->type,&tempType);
        parseType((Type *)local_b8,this);
        Type::operator=(&tempType,(Type *)local_b8);
        this_00 = (Moc *)local_b8;
        Type::~Type((Type *)local_b8);
      }
      bVar6 = Parser::test(&this->super_Parser,LPAREN);
      if (bVar6) {
        QByteArray::operator=(&def->name,&tempType.name);
        uVar9 = (uint)tempType._48_4_ >> 1 & 0x7f;
      }
      else {
        uVar9 = 0;
      }
      Type::~Type(&tempType);
      if (bVar6) goto LAB_0011f150;
    }
  }
LAB_0011f2f0:
  bVar6 = false;
LAB_0011f2f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool Moc::parseMaybeFunction(const ClassDef *cdef, FunctionDef *def)
{
    def->isVirtual = false;
    def->isStatic = false;
    //skip modifiers and attributes
    while (testForFunctionModifiers(def)
        || skipCxxAttributes() || testFunctionAttribute(def) || testFunctionRevision(def)) {}
    bool tilde = test(TILDE);
    def->type = parseType();
    if (def->type.name.isEmpty())
        return false;
    bool scopedFunctionName = false;
    if (test(LPAREN)) {
        def->name = def->type.name;
        scopedFunctionName = def->type.isScoped;
        if (def->name == cdef->classname) {
            def->isDestructor = tilde;
            def->isConstructor = !tilde;
            def->type = Type();
        } else {
            // missing type name? => Skip
            return false;
        }
    } else {
        // ### TODO: The condition before testForFunctionModifiers shoulnd't be necessary,
        // but otherwise we end up with misparses
        if (def->isSlot || def->isSignal || def->isInvokable)
            while (testForFunctionModifiers(def)) {}
        Type tempType = parseType();
        while (!tempType.name.isEmpty() && lookup() != LPAREN) {
            if (testFunctionAttribute(def->type.firstToken, def))
                ; // fine
            else if (def->type.name == "Q_SIGNAL")
                def->isSignal = true;
            else if (def->type.name == "Q_SLOT")
                def->isSlot = true;
            else {
                if (!def->tag.isEmpty())
                    def->tag += ' ';
                def->tag += def->type.name;
            }
            def->type = tempType;
            tempType = parseType();
        }
        if (!test(LPAREN))
            return false;
        def->name = tempType.name;
        scopedFunctionName = tempType.isScoped;
    }

    // we don't support references as return types, it's too dangerous
    if (def->type.referenceType == Type::Reference) {
        QByteArray rawName = def->type.rawName;
        def->type = Type("void");
        def->type.rawName = rawName;
    }

    def->normalizedType = normalizeType(def->type.name);

    if (!test(RPAREN)) {
        parseFunctionArguments(def);
        if (!test(RPAREN))
            return false;
    }
    def->isConst = test(CONST);
    if (scopedFunctionName
        && (def->isSignal || def->isSlot || def->isInvokable)) {
        const QByteArray msg = "parsemaybe: Function declaration " + def->name
                + " contains extra qualification. Ignoring as signal or slot.";
        warning(msg.constData());
        return false;
    }
    return true;
}